

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall
cppcms::impl::tcp_cache_service::server::on_accept
          (server *this,error_code *e,shared_ptr<cppcms::impl::tcp_cache_service::session> *s)

{
  char cVar1;
  level_type lVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  callback *pcVar7;
  intrusive_ptr<booster::callable<void_()>_> aiStack_a8 [6];
  __shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2> local_78;
  string local_68 [32];
  binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  tmp;
  
  iVar3 = e->_M_value;
  lVar2 = booster::log::logger::instance();
  if (iVar3 == 0) {
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x46);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)aiStack_a8,debug,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x135);
      poVar4 = (ostream *)booster::log::message::out();
      poVar4 = std::operator<<(poVar4,"Accepted connection, fd=");
      iVar3 = booster::aio::basic_io_device::native();
      std::ostream::operator<<(poVar4,iVar3);
      booster::log::message::~message((message *)aiStack_a8);
    }
    booster::aio::basic_socket::set_option
              (&((s->
                 super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->socket_,0,1);
    lVar5 = booster::aio::basic_io_device::get_io_service();
    lVar6 = booster::aio::basic_io_device::get_io_service();
    if (lVar5 == lVar6) {
      tcp_cache_service::session::run
                ((s->
                 super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
    }
    else {
      pcVar7 = (callback *)booster::aio::basic_io_device::get_io_service();
      std::__shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_78,
                   &s->
                    super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                  );
      tmp.member = (offset_in_session_to_subr)tcp_cache_service::session::run;
      tmp._8_8_ = 0;
      std::__shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&tmp.object.
                    super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                   ,&local_78);
      booster::callback<void()>::
      callback<cppcms::util::details::binderX<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>>
                ((callback<void()> *)aiStack_a8,&tmp);
      booster::aio::io_service::post(pcVar7);
      booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(aiStack_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tmp.object.
                  super___shared_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    }
    start_accept(this);
  }
  else {
    cVar1 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
    if (cVar1 != '\0') {
      booster::log::message::message
                ((message *)aiStack_a8,error,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x140);
      poVar4 = (ostream *)booster::log::message::out();
      poVar4 = std::operator<<(poVar4,"Failed to accept connection:");
      (**(code **)(*(long *)e->_M_cat + 0x20))(local_68,e->_M_cat,e->_M_value);
      std::operator<<(poVar4,local_68);
      std::__cxx11::string::~string(local_68);
      booster::log::message::~message((message *)aiStack_a8);
    }
  }
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e,booster::shared_ptr<tcp_cache_service::session> s)
	{
		if(!e) {
			BOOSTER_DEBUG("cppcms_scale") << "Accepted connection, fd=" << s->socket_.native();
			s->socket_.set_option(io::stream_socket::tcp_no_delay,true);
			if(&acceptor_.get_io_service()  == &s->socket_.get_io_service()) {
				s->run();
			}
			else {
				s->socket_.get_io_service().post(mem_bind(&session::run,s));
			}
			start_accept();
		}
		else {
			BOOSTER_ERROR("cppcms_scale") << "Failed to accept connection:" << e.message();
		}
	}